

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

void __thiscall Js::JavascriptLibrary::BeginDynamicFunctionReferences(JavascriptLibrary *this)

{
  Type pRVar1;
  Recycler *alloc;
  SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *addr;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if ((this->dynamicFunctionReference).ptr ==
      (SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *)0x0) {
    local_58 = (undefined1  [8])&SList<Js::FunctionProxy*,Memory::Recycler,RealCount>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x1cc7;
    alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
    addr = (SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> *)
           new<Memory::Recycler>(0x18,alloc,0x38bbb2);
    pRVar1 = this->recycler;
    (addr->super_SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount>).
    super_SListNodeBase<Memory::Recycler> = 0;
    ((RealCount *)
    ((long)&addr->super_SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> + 8))->count = 0
    ;
    Memory::Recycler::WBSetBit((char *)addr);
    *(SList<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> **)
     &addr->super_SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> = addr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    ((RealCount *)
    ((long)&addr->super_SListBase<Js::FunctionProxy_*,_Memory::Recycler,_RealCount> + 8))->count = 0
    ;
    addr->allocator = pRVar1;
    Memory::Recycler::WBSetBit((char *)&this->dynamicFunctionReference);
    (this->dynamicFunctionReference).ptr = addr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->dynamicFunctionReference);
    this->dynamicFunctionReferenceDepth = 0;
  }
  this->dynamicFunctionReferenceDepth = this->dynamicFunctionReferenceDepth + 1;
  return;
}

Assistant:

void JavascriptLibrary::BeginDynamicFunctionReferences()
    {
        if (this->dynamicFunctionReference == nullptr)
        {
            this->dynamicFunctionReference = RecyclerNew(this->recycler, FunctionReferenceList, this->recycler);
            this->dynamicFunctionReferenceDepth = 0;
        }

        this->dynamicFunctionReferenceDepth++;
    }